

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::UpdateTexture
          (DeviceContextVkImpl *this,ITexture *pTexture,Uint32 MipLevel,Uint32 Slice,Box *DstBox,
          TextureSubResData *SubresData,RESOURCE_STATE_TRANSITION_MODE SrcBufferStateTransitionMode,
          RESOURCE_STATE_TRANSITION_MODE TextureStateTransitionMode)

{
  TextureDesc *pTVar1;
  Char *pCVar2;
  undefined1 local_88 [8];
  string msg_1;
  undefined1 local_58 [8];
  string msg;
  TextureVkImpl *pTexVk;
  TextureSubResData *SubresData_local;
  Box *DstBox_local;
  Uint32 Slice_local;
  Uint32 MipLevel_local;
  ITexture *pTexture_local;
  DeviceContextVkImpl *this_local;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::UpdateTexture
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,pTexture,MipLevel,Slice,DstBox,
             SubresData,SrcBufferStateTransitionMode,TextureStateTransitionMode);
  msg.field_2._8_8_ = ClassPtrCast<Diligent::TextureVkImpl,Diligent::ITexture>(pTexture);
  pTVar1 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
           ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                      *)msg.field_2._8_8_);
  if (pTVar1->Usage != USAGE_DEFAULT) {
    pTVar1 = DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
             ::GetDesc((DeviceObjectBase<Diligent::ITextureVk,_Diligent::RenderDeviceVkImpl,_Diligent::TextureDesc>
                        *)msg.field_2._8_8_);
    if (pTVar1->Usage != USAGE_SPARSE) {
      FormatString<char[80]>
                ((string *)local_58,
                 (char (*) [80])
                 "Only USAGE_DEFAULT or USAGE_SPARSE textures should be updated with UpdateData()");
      pCVar2 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar2,"UpdateTexture",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x91b);
      std::__cxx11::string::~string((string *)local_58);
    }
  }
  if (SubresData->pSrcBuffer == (IBuffer *)0x0) {
    UpdateTextureRegion(this,SubresData->pData,SubresData->Stride,SubresData->DepthStride,
                        (TextureVkImpl *)msg.field_2._8_8_,MipLevel,Slice,DstBox,
                        TextureStateTransitionMode);
  }
  else {
    FormatString<char[45]>
              ((string *)local_88,(char (*) [45])"Copying buffer to texture is not implemented");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"UpdateTexture",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0x91f);
    std::__cxx11::string::~string((string *)local_88);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::UpdateTexture(ITexture*                      pTexture,
                                        Uint32                         MipLevel,
                                        Uint32                         Slice,
                                        const Box&                     DstBox,
                                        const TextureSubResData&       SubresData,
                                        RESOURCE_STATE_TRANSITION_MODE SrcBufferStateTransitionMode,
                                        RESOURCE_STATE_TRANSITION_MODE TextureStateTransitionMode)
{
    TDeviceContextBase::UpdateTexture(pTexture, MipLevel, Slice, DstBox, SubresData, SrcBufferStateTransitionMode, TextureStateTransitionMode);

    TextureVkImpl* pTexVk = ClassPtrCast<TextureVkImpl>(pTexture);
    // OpenGL backend uses UpdateData() to initialize textures, so we can't check the usage in ValidateUpdateTextureParams()
    DEV_CHECK_ERR(pTexVk->GetDesc().Usage == USAGE_DEFAULT || pTexVk->GetDesc().Usage == USAGE_SPARSE,
                  "Only USAGE_DEFAULT or USAGE_SPARSE textures should be updated with UpdateData()");

    if (SubresData.pSrcBuffer != nullptr)
    {
        UNSUPPORTED("Copying buffer to texture is not implemented");
    }
    else
    {
        UpdateTextureRegion(SubresData.pData, SubresData.Stride, SubresData.DepthStride, *pTexVk,
                            MipLevel, Slice, DstBox, TextureStateTransitionMode);
    }
}